

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall YAML::Emitter::EmitEndMap(Emitter *this)

{
  ostream_wrapper *this_00;
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  ulong uVar2;
  value vVar3;
  value vVar4;
  size_t sVar5;
  size_t in_RCX;
  undefined1 local_29;
  
  _Var1._M_head_impl =
       (this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->m_isGood == true) {
    vVar3 = EmitterState::CurGroupFlowType(_Var1._M_head_impl);
    sVar5 = EmitterState::CurGroupChildCount
                      ((this->m_pState)._M_t.
                       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                       .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    if (sVar5 == 0) {
      EmitterState::ForceFlow
                ((this->m_pState)._M_t.
                 super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                 .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    }
    vVar4 = EmitterState::CurGroupFlowType
                      ((this->m_pState)._M_t.
                       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                       .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl);
    if (vVar4 == Flow) {
      this_00 = &this->m_stream;
      if ((this->m_stream).m_comment == true) {
        ostream_wrapper::write(this_00,0x76ce52,(void *)0x1,in_RCX);
      }
      uVar2 = ((this->m_pState)._M_t.
               super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>.
               _M_t.
               super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
               .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl)->m_curIndent;
      if ((this->m_stream).m_col < uVar2) {
        do {
          local_29 = 0x20;
          ostream_wrapper::write(this_00,(int)&local_29,(void *)0x1,in_RCX);
        } while ((this->m_stream).m_col < uVar2);
      }
      if ((vVar3 == Block) ||
         ((((sVar5 = EmitterState::CurGroupChildCount
                               ((this->m_pState)._M_t.
                                super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                                .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl),
            sVar5 == 0 &&
            (_Var1._M_head_impl =
                  (this->m_pState)._M_t.
                  super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                  .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,
            (_Var1._M_head_impl)->m_hasAnchor == false)) &&
           ((_Var1._M_head_impl)->m_hasTag == false)) &&
          ((_Var1._M_head_impl)->m_hasNonContent == false)))) {
        ostream_wrapper::write(this_00,0x74c62c,(void *)0x1,in_RCX);
      }
      ostream_wrapper::write(this_00,0x74c7ba,(void *)0x1,in_RCX);
    }
    EmitterState::EndedGroup
              ((this->m_pState)._M_t.
               super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>.
               _M_t.
               super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
               .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,Map);
    return;
  }
  return;
}

Assistant:

void Emitter::EmitEndMap() {
  if (!good())
    return;
  FlowType::value originalType = m_pState->CurGroupFlowType();

  if (m_pState->CurGroupChildCount() == 0)
    m_pState->ForceFlow();

  if (m_pState->CurGroupFlowType() == FlowType::Flow) {
    if (m_stream.comment())
      m_stream << "\n";
    m_stream << IndentTo(m_pState->CurIndent());
    if (originalType == FlowType::Block) {
      m_stream << "{";
    } else {
      if (m_pState->CurGroupChildCount() == 0 && !m_pState->HasBegunNode())
        m_stream << "{";
    }
    m_stream << "}";
  }

  m_pState->EndedGroup(GroupType::Map);
}